

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::ModfCaseInstance::compare
          (ModfCaseInstance *this,void **inputs,void **outputs)

{
  int numAccurateBits;
  const_reference pvVar1;
  ostream *poVar2;
  Hex<8UL> HVar3;
  uint local_90;
  float local_8c;
  HexFloat local_70;
  HexFloat local_6c;
  HexFloat local_68;
  uint local_64;
  float local_60;
  deUint32 ulpDiff;
  float resSum;
  deUint32 maxUlpDiff;
  int bitsLost;
  float refOut0;
  float refOut1;
  float out1;
  float out0;
  float in0;
  int compNdx;
  int mantissaBits;
  int scalarSize;
  DataType DStack_2c;
  bool hasZeroSign;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  ModfCaseInstance *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar1 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  DStack_2c = glu::VarType::getBasicType(&pvVar1->varType);
  pvVar1 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  scalarSize = glu::VarType::getPrecision(&pvVar1->varType);
  mantissaBits._3_1_ = supportsSignedZero(scalarSize);
  compNdx = glu::getDataTypeScalarSize(DStack_2c);
  in0 = (float)getMinMantissaBits(scalarSize);
  out0 = 0.0;
  while( true ) {
    if (compNdx <= (int)out0) {
      return true;
    }
    out1 = *(float *)((long)*outputs_local + (long)(int)out0 * 4);
    refOut1 = *(float *)((long)*_precision + (long)(int)out0 * 4);
    refOut0 = *(float *)((long)_precision[1] + (long)(int)out0 * 4);
    bitsLost = (int)(float)(int)out1;
    maxUlpDiff = (deUint32)(out1 - (float)bitsLost);
    if (scalarSize == 2) {
      local_8c = 0.0;
    }
    else {
      local_8c = (float)numBitsLostInOp(out1,(float)maxUlpDiff);
    }
    resSum = local_8c;
    numAccurateBits = de::max<int>((int)in0 - (int)local_8c,0);
    ulpDiff = getMaxUlpDiffFromBits(numAccurateBits);
    local_60 = refOut1 + refOut0;
    if ((mantissaBits._3_1_ & 1) == 0) {
      local_90 = getUlpDiffIgnoreZeroSign(local_60,out1);
    }
    else {
      local_90 = getUlpDiff(local_60,out1);
    }
    local_64 = local_90;
    if (ulpDiff < local_90) break;
    out0 = (float)((int)out0 + 1);
  }
  poVar2 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                           "Expected [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)out0);
  poVar2 = std::operator<<(poVar2,"] = (");
  HexFloat::HexFloat(&local_68,(float)maxUlpDiff);
  poVar2 = anon_unknown_0::operator<<(poVar2,&local_68);
  poVar2 = std::operator<<(poVar2,") + (");
  HexFloat::HexFloat(&local_6c,(float)bitsLost);
  poVar2 = anon_unknown_0::operator<<(poVar2,&local_6c);
  poVar2 = std::operator<<(poVar2,") = ");
  HexFloat::HexFloat(&local_70,out1);
  poVar2 = anon_unknown_0::operator<<(poVar2,&local_70);
  poVar2 = std::operator<<(poVar2," with ULP threshold ");
  HVar3 = tcu::toHex<unsigned_int>(ulpDiff);
  poVar2 = tcu::Format::operator<<(poVar2,HVar3);
  poVar2 = std::operator<<(poVar2,", got ULP diff ");
  HVar3 = tcu::toHex<unsigned_int>(local_64);
  tcu::Format::operator<<(poVar2,HVar3);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		out1		= ((const float*)outputs[1])[compNdx];

			const float		refOut1		= float(int(in0));
			const float		refOut0		= in0 - refOut1;

			const int		bitsLost	= precision != glu::PRECISION_HIGHP ? numBitsLostInOp(in0, refOut0) : 0;
			const deUint32	maxUlpDiff	= getMaxUlpDiffFromBits(de::max(mantissaBits - bitsLost, 0));

			const float		resSum		= out0 + out1;

			const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(resSum, in0) : getUlpDiffIgnoreZeroSign(resSum, in0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = (" << HexFloat(refOut0) << ") + (" << HexFloat(refOut1) << ") = " << HexFloat(in0) << " with ULP threshold "
							<< tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}